

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O1

void __thiscall
icu_63::OlsonTimeZone::getHistoricalOffset
          (OlsonTimeZone *this,UDate date,UBool local,int32_t NonExistingTimeOpt,
          int32_t DuplicatedTimeOpt,int32_t *rawoff,int32_t *dstoff)

{
  int32_t *piVar1;
  uint8_t *puVar2;
  int iVar3;
  int64_t iVar4;
  long lVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ushort uVar15;
  ushort uVar16;
  int iVar17;
  bool bVar18;
  bool bVar19;
  double dVar20;
  
  uVar15 = this->transitionCount32 + this->transitionCountPre32 + this->transitionCountPost32;
  if (((short)uVar15 < 1) ||
     ((dVar20 = uprv_floor_63(date / 1000.0), local == '\0' &&
      (iVar4 = transitionTimeInSeconds(this,0), dVar20 < (double)iVar4)))) {
    piVar6 = this->typeOffsets;
    *rawoff = *piVar6 * 1000;
    piVar6 = piVar6 + 1;
  }
  else {
    piVar1 = this->typeOffsets;
    puVar2 = this->typeMapData;
    uVar7 = NonExistingTimeOpt & 3;
    uVar8 = DuplicatedTimeOpt & 3;
    uVar12 = (ulong)uVar15;
    do {
      uVar15 = (short)uVar12 - 1;
      iVar17 = (int)uVar12;
      if ((short)uVar15 < 0) {
        uVar12 = 0;
        goto LAB_001f34eb;
      }
      lVar5 = transitionTimeInSeconds(this,uVar15);
      if ((local != '\0') && ((double)(lVar5 + -0x15180) <= dVar20)) {
        uVar16 = (short)uVar12 - 2;
        if ((short)uVar16 < 0) {
          uVar9 = 0;
          lVar14 = 1;
        }
        else {
          uVar9 = (uint)puVar2[uVar16] * 2;
          lVar14 = (ulong)puVar2[uVar16] * 2 + 1;
        }
        iVar10 = *(int *)((long)piVar1 + (ulong)(uVar9 << 2 | 4)) + piVar1[uVar9];
        bVar18 = piVar1[lVar14] != 0;
        iVar13 = *(int *)((long)piVar1 + (ulong)((uint)puVar2[uVar15] * 8)) +
                 piVar1[(ulong)puVar2[uVar15] * 2 + 1];
        bVar19 = piVar1[(ulong)puVar2[uVar15] * 2 + 1] == 0;
        if (iVar13 < iVar10) {
          iVar11 = iVar13;
          if ((uVar8 != 1 || (!bVar19 || !bVar18)) && (uVar8 != 3 || (bVar19 || bVar18))) {
            if ((DuplicatedTimeOpt & 0xcU) == 4) {
              iVar13 = iVar10;
            }
            iVar3 = iVar13;
            if (bVar19 && bVar18) {
              iVar3 = iVar10;
            }
            if (uVar8 != 3) {
              iVar3 = iVar13;
            }
            if (bVar19 || bVar18) {
              iVar10 = iVar3;
            }
            iVar11 = iVar10;
            if (uVar8 != 1) {
              iVar11 = iVar3;
            }
          }
        }
        else {
          iVar11 = iVar10;
          if ((uVar7 != 1 || (!bVar19 || !bVar18)) && (uVar7 != 3 || (bVar19 || bVar18))) {
            if ((NonExistingTimeOpt & 0xcU) != 0xc) {
              iVar10 = iVar13;
            }
            iVar3 = iVar10;
            if (bVar19 && bVar18) {
              iVar3 = iVar13;
            }
            if (uVar7 != 3) {
              iVar3 = iVar10;
            }
            if (bVar19 || bVar18) {
              iVar13 = iVar3;
            }
            iVar11 = iVar13;
            if (uVar7 != 1) {
              iVar11 = iVar3;
            }
          }
        }
        lVar5 = lVar5 + iVar11;
      }
      uVar12 = (ulong)uVar15;
    } while (dVar20 < (double)lVar5);
    if ((short)uVar15 < 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (ulong)((uint)this->typeMapData[uVar15] * 2);
    }
LAB_001f34eb:
    piVar1 = this->typeOffsets;
    *rawoff = piVar1[uVar12] * 1000;
    if ((short)uVar15 < 0) {
      lVar5 = 1;
    }
    else {
      lVar5 = (ulong)this->typeMapData[iVar17 - 1U & 0xffff] * 2 + 1;
    }
    piVar6 = piVar1 + lVar5;
  }
  *dstoff = *piVar6 * 1000;
  return;
}

Assistant:

void
OlsonTimeZone::getHistoricalOffset(UDate date, UBool local,
                                   int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt,
                                   int32_t& rawoff, int32_t& dstoff) const {
    U_DEBUG_TZ_MSG(("getHistoricalOffset(%.1f, %s, %d, %d, raw, dst)\n",
        date, local?"T":"F", NonExistingTimeOpt, DuplicatedTimeOpt));
#if defined U_DEBUG_TZ
        printTime(date*1000.0);
#endif
    int16_t transCount = transitionCount();

    if (transCount > 0) {
        double sec = uprv_floor(date / U_MILLIS_PER_SECOND);
        if (!local && sec < transitionTimeInSeconds(0)) {
            // Before the first transition time
            rawoff = initialRawOffset() * U_MILLIS_PER_SECOND;
            dstoff = initialDstOffset() * U_MILLIS_PER_SECOND;
        } else {
            // Linear search from the end is the fastest approach, since
            // most lookups will happen at/near the end.
            int16_t transIdx;
            for (transIdx = transCount - 1; transIdx >= 0; transIdx--) {
                int64_t transition = transitionTimeInSeconds(transIdx);

                if (local && (sec >= (transition - MAX_OFFSET_SECONDS))) {
                    int32_t offsetBefore = zoneOffsetAt(transIdx - 1);
                    UBool dstBefore = dstOffsetAt(transIdx - 1) != 0;

                    int32_t offsetAfter = zoneOffsetAt(transIdx);
                    UBool dstAfter = dstOffsetAt(transIdx) != 0;

                    UBool dstToStd = dstBefore && !dstAfter;
                    UBool stdToDst = !dstBefore && dstAfter;
                    
                    if (offsetAfter - offsetBefore >= 0) {
                        // Positive transition, which makes a non-existing local time range
                        if (((NonExistingTimeOpt & kStdDstMask) == kStandard && dstToStd)
                                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
                            transition += offsetBefore;
                        } else if (((NonExistingTimeOpt & kStdDstMask) == kStandard && stdToDst)
                                || ((NonExistingTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
                            transition += offsetAfter;
                        } else if ((NonExistingTimeOpt & kFormerLatterMask) == kLatter) {
                            transition += offsetBefore;
                        } else {
                            // Interprets the time with rule before the transition,
                            // default for non-existing time range
                            transition += offsetAfter;
                        }
                    } else {
                        // Negative transition, which makes a duplicated local time range
                        if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && dstToStd)
                                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && stdToDst)) {
                            transition += offsetAfter;
                        } else if (((DuplicatedTimeOpt & kStdDstMask) == kStandard && stdToDst)
                                || ((DuplicatedTimeOpt & kStdDstMask) == kDaylight && dstToStd)) {
                            transition += offsetBefore;
                        } else if ((DuplicatedTimeOpt & kFormerLatterMask) == kFormer) {
                            transition += offsetBefore;
                        } else {
                            // Interprets the time with rule after the transition,
                            // default for duplicated local time range
                            transition += offsetAfter;
                        }
                    }
                }
                if (sec >= transition) {
                    break;
                }
            }
            // transIdx could be -1 when local=true
            rawoff = rawOffsetAt(transIdx) * U_MILLIS_PER_SECOND;
            dstoff = dstOffsetAt(transIdx) * U_MILLIS_PER_SECOND;
        }
    } else {
        // No transitions, single pair of offsets only
        rawoff = initialRawOffset() * U_MILLIS_PER_SECOND;
        dstoff = initialDstOffset() * U_MILLIS_PER_SECOND;
    }
    U_DEBUG_TZ_MSG(("getHistoricalOffset(%.1f, %s, %d, %d, raw, dst) - raw=%d, dst=%d\n",
        date, local?"T":"F", NonExistingTimeOpt, DuplicatedTimeOpt, rawoff, dstoff));
}